

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseServiceTest_MethodsAndStreams_Test::
~ParseServiceTest_MethodsAndStreams_Test(ParseServiceTest_MethodsAndStreams_Test *this)

{
  ParseServiceTest_MethodsAndStreams_Test *this_local;
  
  ~ParseServiceTest_MethodsAndStreams_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseServiceTest, MethodsAndStreams) {
  ExpectParsesTo(
      "service TestService {\n"
      "  rpc Foo(In1) returns (Out1);\n"
      "  rpc Bar(In2) returns (Out2);\n"
      "  rpc Baz(In3) returns (Out3);\n"
      "}\n",

      "service {"
      "  name: \"TestService\""
      "  method { name:\"Foo\" input_type:\"In1\" output_type:\"Out1\" }"
      "  method { name:\"Bar\" input_type:\"In2\" output_type:\"Out2\" }"
      "  method { name:\"Baz\" input_type:\"In3\" output_type:\"Out3\" }"
      "}");
}